

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O2

SignatureT __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx>::makeFuncType
          (TypeParserCtx<wasm::WATParser::ParseTypeDefsCtx> *this,ParamsT *params,ResultsT *results)

{
  TypeT TVar1;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__x;
  SignatureT SVar2;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_80;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_68;
  _Vector_base<wasm::Type,_std::allocator<wasm::Type>_> local_50;
  undefined1 auStack_38 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> empty;
  
  auStack_38 = (undefined1  [8])0x0;
  empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  empty.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (params == (ParamsT *)0x0) {
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_50,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_38);
  }
  else {
    getUnnamedTypes((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_50,params);
  }
  __x = (vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_38;
  if (results != (ResultsT *)0x0) {
    __x = results;
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_80,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_50);
  SVar2.params.id =
       ParseTypeDefsCtx::makeTupleType
                 ((ParseTypeDefsCtx *)this,
                  (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_80);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_68,__x);
  TVar1 = ParseTypeDefsCtx::makeTupleType
                    ((ParseTypeDefsCtx *)this,
                     (vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_68);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_68);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_80);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base(&local_50);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_38);
  SVar2.results.id = TVar1.id;
  return SVar2;
}

Assistant:

SignatureT makeFuncType(ParamsT* params, ResultsT* results) {
    std::vector<Type> empty;
    const auto& paramTypes = params ? getUnnamedTypes(*params) : empty;
    const auto& resultTypes = results ? *results : empty;
    return Signature(self().makeTupleType(paramTypes),
                     self().makeTupleType(resultTypes));
  }